

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleObjectHandling.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Slice slice;
  ostream *poVar2;
  Slice slice_00;
  Slice slice_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  Builder *sub;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attrName_03;
  string_view attrName_04;
  uint8_t *local_210;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  Builder values;
  ArrayIterator __begin1;
  Builder b;
  string local_50;
  
  arangodb::velocypack::Builder::Builder(&b);
  arangodb::velocypack::Value::Value((Value *)&values,Object,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)&values);
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xb;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 3;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2a;
  attrName._M_str = "foo";
  attrName._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName,(Value *)&values);
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xe;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 6;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_400a;
  attrName_00._M_str = "bar";
  attrName_00._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_00,(Value *)&values);
  arangodb::velocypack::Value::Value((Value *)&values,Object,false);
  attrName_01._M_str = "baz";
  attrName_01._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_01,(Value *)&values);
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 3;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 1;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 1;
  attrName_02._M_str = "qux";
  attrName_02._M_len = 3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_02,(Value *)&values);
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xe;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 6;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_404a;
  iVar4 = 4;
  attrName_03._M_str = "bart";
  attrName_03._M_len = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_03,(Value *)&values);
  arangodb::velocypack::Builder::close(&b,iVar4);
  arangodb::velocypack::Value::Value((Value *)&values,Array,false);
  attrName_04._M_str = "quux";
  attrName_04._M_len = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_04,(Value *)&values);
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xb;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 3;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)&values);
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xb;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 3;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)&values);
  sub = &values;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._0_1_ = 0xb;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ._4_4_ = 3;
  values._buffer.
  super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)sub);
  iVar4 = (int)sub;
  arangodb::velocypack::Builder::close(&b,iVar4);
  arangodb::velocypack::Builder::close(&b,iVar4);
  slice._start = arangodb::velocypack::Builder::start(&b);
  arangodb::velocypack::Collection::keys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&values,(Collection *)slice._start,slice_01);
  _Var1 = values._buffer.
          super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  for (p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(values._buffer.
                         super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._4_4_,
                         values._buffer.
                         super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_4_); p_Var3 != _Var1._M_pi; p_Var3 = p_Var3 + 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Object has key \'");
    poVar2 = std::operator<<(poVar2,(string *)p_Var3);
    poVar2 = std::operator<<(poVar2,"\'");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&values);
  arangodb::velocypack::Collection::values(&values,slice);
  slice_00 = arangodb::velocypack::Builder::slice(&values);
  arangodb::velocypack::ArrayIterator::ArrayIterator((ArrayIterator *)&local_208,slice_00);
  __begin1._size = (ValueLength)local_1f8;
  __begin1._position = (ValueLength)pcStack_1f0;
  __begin1._slice._start = (uint8_t *)local_208._M_unused._0_8_;
  __begin1._current = (uint8_t *)local_208._8_8_;
  while (__begin1._position != __begin1._size) {
    local_210 = (uint8_t *)arangodb::velocypack::ArrayIterator::value(&__begin1);
    poVar2 = std::operator<<((ostream *)&std::cout,"Object value is: ");
    poVar2 = arangodb::velocypack::operator<<(poVar2,(Slice *)&local_210);
    poVar2 = std::operator<<(poVar2,", as JSON: ");
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
    toJson_abi_cxx11_(&local_50,
                      (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                      &local_210,&arangodb::velocypack::Options::Defaults);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_50);
    arangodb::velocypack::ArrayIterator::next(&__begin1);
  }
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  pcStack_1f0 = std::
                _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleObjectHandling.cpp:48:7)>
                ::_M_invoke;
  local_1f8 = std::
              _Function_handler<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleObjectHandling.cpp:48:7)>
              ::_M_manager;
  arangodb::velocypack::Collection::visitRecursive
            (slice,PostOrder,
             (function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *)&local_208
            );
  std::_Function_base::~_Function_base((_Function_base *)&local_208);
  arangodb::velocypack::Builder::~Builder(&values);
  arangodb::velocypack::Builder::~Builder(&b);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with a few members
  Builder b;

  b(Value(ValueType::Object));
  b.add("foo", Value(42));
  b.add("bar", Value("some string value"));
  b.add("baz", Value(ValueType::Object));
  b.add("qux", Value(true));
  b.add("bart", Value("this is a string"));
  b.close();
  b.add("quux", Value(ValueType::Array));
  b.add(Value(1));
  b.add(Value(2));
  b.add(Value(3));
  b.close();
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // get all object keys. returns a vector of strings
  for (auto const& key : Collection::keys(s)) {
    // print key
    std::cout << "Object has key '" << key << "'" << std::endl;
  }

  // get all object values. returns a Builder object with an Array inside
  Builder values = Collection::values(s);
  for (auto const& value : ArrayIterator(values.slice())) {
    std::cout << "Object value is: " << value << ", as JSON: " << value.toJson()
              << std::endl;
  }

  // recursively visit all members in the Object
  // PostOrder here means we'll be visiting compound members before
  // we're diving into their subvalues
  Collection::visitRecursive(
      s, Collection::PostOrder,
      [](Slice const& key, Slice const& value) -> bool {
        if (!key.isNone()) {
          // we are visiting an Object member
          std::cout << "Visiting Object member: " << key.copyString()
                    << ", value: " << value.toJson() << std::endl;
        } else {
          // we are visiting an Array member
          std::cout << "Visiting Array member: " << value.toJson() << std::endl;
        }
        // to continue visiting, return true. to abort visiting, return false
        return true;
      });

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}